

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall xLearn::Reader::~Reader(Reader *this)

{
  pointer pcVar1;
  
  this->_vptr_Reader = (_func_int **)&PTR__Reader_0016ced0;
  pcVar1 = (this->splitor_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->splitor_).field_2) {
    operator_delete(pcVar1);
  }
  DMatrix::~DMatrix(&this->data_samples_);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Reader() {  }